

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O2

void __thiscall polyscope::render::Engine::buildEngineGui(Engine *this)

{
  TransparencyMode *this_00;
  TransparencyMode TVar1;
  bool bVar2;
  int iVar3;
  TransparencyMode *m_00;
  TransparencyMode *extraout_RDX;
  TransparencyMode *m_01;
  TransparencyMode *extraout_RDX_00;
  int *v;
  long lVar4;
  char *fmt;
  string matName;
  string mName;
  string matName_1;
  TransparencyMode m;
  undefined4 uStack_17c;
  undefined8 local_178;
  undefined1 local_170 [16];
  string fileext;
  string local_140;
  string local_120;
  string local_100;
  string local_e0;
  string local_c0;
  string local_a0;
  string local_80;
  string local_60;
  string *local_40;
  TransparencyMode *local_38;
  
  ImGui::SetNextItemOpen(false,4);
  bVar2 = ImGui::TreeNode("Appearance");
  if (!bVar2) {
    return;
  }
  ImGui::PushItemWidth(120.0);
  if ((buildEngineGui()::displayBackgroundName_abi_cxx11_ == '\0') &&
     (iVar3 = __cxa_guard_acquire(&buildEngineGui()::displayBackgroundName_abi_cxx11_), iVar3 != 0))
  {
    std::__cxx11::string::string
              ((string *)&buildEngineGui()::displayBackgroundName_abi_cxx11_,"None",
               (allocator *)&mName);
    __cxa_atexit(std::__cxx11::string::~string,&buildEngineGui()::displayBackgroundName_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&buildEngineGui()::displayBackgroundName_abi_cxx11_);
  }
  ImGui::ColorEdit4("background color",(float *)&view::bgColor,0x20);
  ImGui::SetNextItemOpen(false,4);
  bVar2 = ImGui::TreeNode("Transparency");
  if (!bVar2) goto LAB_001abdb1;
  this_00 = &this->transparencyMode;
  modeName_abi_cxx11_(&mName,(polyscope *)this_00,m_00);
  bVar2 = ImGui::BeginCombo("Mode",mName._M_dataplus._M_p,0);
  std::__cxx11::string::~string((string *)&mName);
  if (bVar2) {
    matName._M_dataplus._M_p = (pointer)0x100000000;
    matName._M_string_length._0_4_ = 2;
    m_01 = extraout_RDX;
    for (lVar4 = 0; lVar4 != 0xc; lVar4 = lVar4 + 4) {
      TVar1 = *(TransparencyMode *)((long)&matName._M_dataplus._M_p + lVar4);
      _m = (undefined1 *)CONCAT44(uStack_17c,TVar1);
      modeName_abi_cxx11_(&mName,(polyscope *)&m,m_01);
      matName_1._M_dataplus._M_p = (pointer)0x0;
      bVar2 = ImGui::Selectable(mName._M_dataplus._M_p,*this_00 == TVar1,0,(ImVec2 *)&matName_1);
      if (bVar2) {
        options::transparencyMode = TVar1;
        requestRedraw();
      }
      std::__cxx11::string::~string((string *)&mName);
      m_01 = extraout_RDX_00;
    }
    ImGui::EndCombo();
  }
  TVar1 = *this_00;
  if (TVar1 == Pretty) {
    ImGui::TextWrapped(
                      "Accurate but expensive transparent rendering. Increase the number of passes to resolve complicated scenes."
                      );
    bVar2 = ImGui::InputInt("Render Passes",&options::transparencyRenderPasses,1,100,0);
    if (bVar2) {
      requestRedraw();
    }
  }
  else {
    if (TVar1 == Simple) {
      fmt = 
      "Simple transparent rendering. Efficient, but objects at different depths may not look right."
      ;
    }
    else {
      if (TVar1 != None) goto LAB_001abdac;
      fmt = "Transparency effects are disabled and all related options are ignored.";
    }
    ImGui::TextWrapped(fmt);
  }
LAB_001abdac:
  ImGui::TreePop();
LAB_001abdb1:
  GroundPlane::buildGui(&this->groundPlane);
  ImGui::SetNextItemOpen(false,4);
  bVar2 = ImGui::TreeNode("Tone Mapping");
  if (bVar2) {
    ImGui::SliderFloat("exposure",&this->exposure,0.1,2.0,"%.3f",2.0);
    ImGui::SliderFloat("white level",&this->whiteLevel,0.0,2.0,"%.3f",2.0);
    ImGui::SliderFloat("gamma",&this->gamma,0.5,3.0,"%.3f",2.0);
    ImGui::TreePop();
  }
  ImGui::SetNextItemOpen(false,4);
  bVar2 = ImGui::TreeNode("Anti-Aliasing");
  if (bVar2) {
    v = &this->ssaaFactor;
    bVar2 = ImGui::InputInt("SSAA (pretty)",v,1,100,0);
    if (bVar2) {
      iVar3 = 4;
      if (*v < 4) {
        iVar3 = *v;
      }
      options::ssaaFactor = 1;
      if (1 < iVar3) {
        options::ssaaFactor = iVar3;
      }
      *v = options::ssaaFactor;
      requestRedraw();
    }
    ImGui::TreePop();
  }
  ImGui::SetNextItemOpen(false,4);
  bVar2 = ImGui::TreeNode("Materials");
  if (bVar2) {
    ImGui::SetNextItemOpen(false,4);
    bVar2 = ImGui::TreeNode("Load material");
    if (bVar2) {
      if ((buildEngineGui()::buffName == '\0') &&
         (iVar3 = __cxa_guard_acquire(&buildEngineGui()::buffName), iVar3 != 0)) {
        std::vector<char,_std::allocator<char>_>::vector
                  (&buildEngineGui::buffName,0x200,(allocator_type *)&mName);
        __cxa_atexit(std::vector<char,_std::allocator<char>_>::~vector,&buildEngineGui::buffName,
                     &__dso_handle);
        __cxa_guard_release(&buildEngineGui()::buffName);
      }
      ImGui::InputText("Material name",
                       buildEngineGui::buffName.super__Vector_base<char,_std::allocator<char>_>.
                       _M_impl.super__Vector_impl_data._M_start,0x200,0,(ImGuiInputTextCallback)0x0,
                       (void *)0x0);
      if ((buildEngineGui()::buffFile == '\0') &&
         (iVar3 = __cxa_guard_acquire(&buildEngineGui()::buffFile), iVar3 != 0)) {
        std::vector<char,_std::allocator<char>_>::vector
                  (&buildEngineGui::buffFile,0x200,(allocator_type *)&mName);
        __cxa_atexit(std::vector<char,_std::allocator<char>_>::~vector,&buildEngineGui::buffFile,
                     &__dso_handle);
        __cxa_guard_release(&buildEngineGui()::buffFile);
      }
      ImGui::InputText("File name",
                       buildEngineGui::buffFile.super__Vector_base<char,_std::allocator<char>_>.
                       _M_impl.super__Vector_impl_data._M_start,0x200,0,(ImGuiInputTextCallback)0x0,
                       (void *)0x0);
      mName._M_dataplus._M_p = (pointer)0x0;
      bVar2 = ImGui::Button("Load static material",(ImVec2 *)&mName);
      if (bVar2) {
        std::__cxx11::string::string
                  ((string *)&mName,
                   buildEngineGui::buffFile.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start,(allocator *)&matName);
        std::__cxx11::string::string
                  ((string *)&matName,
                   buildEngineGui::buffName.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start,(allocator *)&matName_1);
        std::__cxx11::string::string((string *)&local_60,(string *)&matName);
        std::__cxx11::string::string((string *)&local_80,(string *)&mName);
        polyscope::loadStaticMaterial(&local_60,&local_80);
        std::__cxx11::string::~string((string *)&local_80);
        std::__cxx11::string::~string((string *)&local_60);
        std::__cxx11::string::~string((string *)&matName);
        std::__cxx11::string::~string((string *)&mName);
      }
      mName._M_dataplus._M_p = (pointer)0x0;
      bVar2 = ImGui::Button("Load blendable material",(ImVec2 *)&mName);
      if (bVar2) {
        std::__cxx11::string::string
                  ((string *)&matName,
                   buildEngineGui::buffFile.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start,(allocator *)&mName);
        std::__cxx11::string::string
                  ((string *)&matName_1,
                   buildEngineGui::buffName.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start,(allocator *)&mName);
        _m = local_170;
        fileext._M_dataplus._M_p = (pointer)&fileext.field_2;
        local_178 = 0;
        fileext._M_string_length = 0;
        local_170[0] = 0;
        fileext.field_2._M_local_buf[0] = '\0';
        std::__cxx11::string::string((string *)&local_a0,(string *)&matName);
        splitExt((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&mName,&local_a0);
        local_40 = &fileext;
        local_38 = &m;
        std::tuple<std::__cxx11::string&,std::__cxx11::string&>::operator=
                  ((tuple<std::__cxx11::string&,std::__cxx11::string&> *)&local_40,
                   (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&mName);
        std::
        _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~_Tuple_impl((_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&mName);
        std::__cxx11::string::~string((string *)&local_a0);
        std::__cxx11::string::string((string *)&local_c0,(string *)&matName_1);
        std::__cxx11::string::string((string *)&local_e0,(string *)&m);
        std::__cxx11::string::string((string *)&local_100,(string *)&fileext);
        polyscope::loadBlendableMaterial(&local_c0,&local_e0,&local_100);
        std::__cxx11::string::~string((string *)&local_100);
        std::__cxx11::string::~string((string *)&local_e0);
        std::__cxx11::string::~string((string *)&local_c0);
        std::__cxx11::string::~string((string *)&fileext);
        std::__cxx11::string::~string((string *)&m);
        std::__cxx11::string::~string((string *)&matName_1);
        std::__cxx11::string::~string((string *)&matName);
      }
      ImGui::TreePop();
    }
    ImGui::TreePop();
  }
  bVar2 = ImGui::TreeNode("Color Maps");
  if (bVar2) {
    ImGui::SetNextItemOpen(false,4);
    bVar2 = ImGui::TreeNode("Load color map");
    if (bVar2) {
      if ((buildEngineGui()::buffName == '\0') &&
         (iVar3 = __cxa_guard_acquire(&buildEngineGui()::buffName), iVar3 != 0)) {
        std::vector<char,_std::allocator<char>_>::vector
                  (&buildEngineGui()::buffName,0x200,(allocator_type *)&mName);
        __cxa_atexit(std::vector<char,_std::allocator<char>_>::~vector,&buildEngineGui()::buffName,
                     &__dso_handle);
        __cxa_guard_release(&buildEngineGui()::buffName);
      }
      ImGui::InputText("Color map name",
                       buildEngineGui()::buffName.super__Vector_base<char,_std::allocator<char>_>.
                       _M_impl.super__Vector_impl_data._M_start,0x200,0,(ImGuiInputTextCallback)0x0,
                       (void *)0x0);
      if ((buildEngineGui()::buffFile == '\0') &&
         (iVar3 = __cxa_guard_acquire(&buildEngineGui()::buffFile), iVar3 != 0)) {
        std::vector<char,_std::allocator<char>_>::vector
                  (&buildEngineGui()::buffFile,0x200,(allocator_type *)&mName);
        __cxa_atexit(std::vector<char,_std::allocator<char>_>::~vector,&buildEngineGui()::buffFile,
                     &__dso_handle);
        __cxa_guard_release(&buildEngineGui()::buffFile);
      }
      ImGui::InputText("File name",
                       buildEngineGui()::buffFile.super__Vector_base<char,_std::allocator<char>_>.
                       _M_impl.super__Vector_impl_data._M_start,0x200,0,(ImGuiInputTextCallback)0x0,
                       (void *)0x0);
      mName._M_dataplus._M_p = (pointer)0x0;
      bVar2 = ImGui::Button("Load",(ImVec2 *)&mName);
      if (bVar2) {
        std::__cxx11::string::string
                  ((string *)&mName,
                   buildEngineGui()::buffFile.super__Vector_base<char,_std::allocator<char>_>.
                   _M_impl.super__Vector_impl_data._M_start,(allocator *)&matName);
        std::__cxx11::string::string
                  ((string *)&matName,
                   buildEngineGui()::buffName.super__Vector_base<char,_std::allocator<char>_>.
                   _M_impl.super__Vector_impl_data._M_start,(allocator *)&matName_1);
        std::__cxx11::string::string((string *)&local_120,(string *)&matName);
        std::__cxx11::string::string((string *)&local_140,(string *)&mName);
        polyscope::loadColorMap(&local_120,&local_140);
        std::__cxx11::string::~string((string *)&local_140);
        std::__cxx11::string::~string((string *)&local_120);
        std::__cxx11::string::~string((string *)&matName);
        std::__cxx11::string::~string((string *)&mName);
      }
      ImGui::TreePop();
    }
    ImGui::TreePop();
  }
  ImGui::TreePop();
  return;
}

Assistant:

void Engine::buildEngineGui() {

  ImGui::SetNextTreeNodeOpen(false, ImGuiCond_FirstUseEver);
  if (ImGui::TreeNode("Appearance")) {

    // == Display
    ImGui::PushItemWidth(120);
    // ImGui::Text("Background");
    // ImGui::SameLine();
    static std::string displayBackgroundName = "None";
    // if (ImGui::BeginCombo("##Background", displayBackgroundName.c_str())) {
    // if (ImGui::Selectable("None", background == BackgroundView::None)) {
    // background = BackgroundView::None;
    // ImGui::SetItemDefaultFocus();
    // displayBackgroundName = "None";
    //}
    // ImGui::EndCombo();
    //}

    ImGui::ColorEdit4("background color", (float*)&view::bgColor, ImGuiColorEditFlags_NoInputs);

    // == Transparency
    ImGui::SetNextTreeNodeOpen(false, ImGuiCond_FirstUseEver);
    if (ImGui::TreeNode("Transparency")) {

      if (ImGui::BeginCombo("Mode", modeName(transparencyMode).c_str())) {
        for (TransparencyMode m : {TransparencyMode::None, TransparencyMode::Simple, TransparencyMode::Pretty}) {
          std::string mName = modeName(m);
          if (ImGui::Selectable(mName.c_str(), transparencyMode == m)) {
            options::transparencyMode = m;
            requestRedraw();
          }
        }
        ImGui::EndCombo();
      }

      switch (transparencyMode) {
      case TransparencyMode::None: {
        ImGui::TextWrapped("Transparency effects are disabled and all related options are ignored.");
        break;
      }
      case TransparencyMode::Simple: {
        ImGui::TextWrapped(
            "Simple transparent rendering. Efficient, but objects at different depths may not look right.");
        break;
      }
      case TransparencyMode::Pretty: {
        ImGui::TextWrapped("Accurate but expensive transparent rendering. Increase the number of passes to resolve "
                           "complicated scenes.");
        if (ImGui::InputInt("Render Passes", &options::transparencyRenderPasses)) {
          requestRedraw();
        }
        break;
      }
      }

      ImGui::TreePop();
    }

    // == Ground plane
    groundPlane.buildGui();

    ImGui::SetNextTreeNodeOpen(false, ImGuiCond_FirstUseEver);
    if (ImGui::TreeNode("Tone Mapping")) {
      ImGui::SliderFloat("exposure", &exposure, 0.1, 2.0, "%.3f", 2.);
      ImGui::SliderFloat("white level", &whiteLevel, 0.0, 2.0, "%.3f", 2.);
      ImGui::SliderFloat("gamma", &gamma, 0.5, 3.0, "%.3f", 2.);

      ImGui::TreePop();
    }

    // == Anti-aliasing
    ImGui::SetNextTreeNodeOpen(false, ImGuiCond_FirstUseEver);
    if (ImGui::TreeNode("Anti-Aliasing")) {
      if (ImGui::InputInt("SSAA (pretty)", &ssaaFactor, 1)) {
        ssaaFactor = std::min(ssaaFactor, 4);
        ssaaFactor = std::max(ssaaFactor, 1);
        options::ssaaFactor = ssaaFactor;
        requestRedraw();
      }
      ImGui::TreePop();
    }

    // == Materials
    ImGui::SetNextTreeNodeOpen(false, ImGuiCond_FirstUseEver);
    if (ImGui::TreeNode("Materials")) {

      ImGui::SetNextTreeNodeOpen(false, ImGuiCond_FirstUseEver);
      if (ImGui::TreeNode("Load material")) {

        size_t buffLen = 512;
        static std::vector<char> buffName(buffLen);
        ImGui::InputText("Material name", &buffName[0], buffLen);
        static std::vector<char> buffFile(buffLen);
        ImGui::InputText("File name", &buffFile[0], buffLen);

        if (ImGui::Button("Load static material")) {
          std::string filename(&buffFile[0]);
          std::string matName(&buffName[0]);
          polyscope::loadStaticMaterial(matName, filename);
        }

        if (ImGui::Button("Load blendable material")) {
          std::string filename(&buffFile[0]);
          std::string matName(&buffName[0]);
          std::string filebase, fileext;
          std::tie(filebase, fileext) = splitExt(filename);
          polyscope::loadBlendableMaterial(matName, filebase, fileext);
        }

        ImGui::TreePop();
      }

      ImGui::TreePop();
    }

    // == Color maps
    if (ImGui::TreeNode("Color Maps")) {

      ImGui::SetNextTreeNodeOpen(false, ImGuiCond_FirstUseEver);
      if (ImGui::TreeNode("Load color map")) {

        size_t buffLen = 512;
        static std::vector<char> buffName(buffLen);
        ImGui::InputText("Color map name", &buffName[0], buffLen);
        static std::vector<char> buffFile(buffLen);
        ImGui::InputText("File name", &buffFile[0], buffLen);

        if (ImGui::Button("Load")) {
          std::string filename(&buffFile[0]);
          std::string cmapName(&buffName[0]);
          polyscope::loadColorMap(cmapName, filename);
        }

        ImGui::TreePop();
      }

      ImGui::TreePop();
    }

    ImGui::TreePop();
  }
}